

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O2

int mbedtls_asn1_write_named_bitstring(uchar **p,uchar *start,uchar *buf,size_t bits)

{
  int iVar1;
  ulong uVar2;
  byte *pbVar3;
  byte bVar4;
  
  if (bits != 0) {
    pbVar3 = buf + ((bits + 7 >> 3) - 1);
    bVar4 = *pbVar3 >> (((byte)(bits + 7) & 0xf8) - (char)bits & 0x1f);
    while ((uVar2 = bits - 1, (bVar4 & 1) == 0 && (bits = 0, uVar2 != 0))) {
      bVar4 = bVar4 >> 1;
      bits = uVar2;
      if ((uVar2 & 7) == 0) {
        bVar4 = pbVar3[-1];
        pbVar3 = pbVar3 + -1;
      }
    }
    iVar1 = mbedtls_asn1_write_bitstring(p,start,buf,bits);
    return iVar1;
  }
  iVar1 = mbedtls_asn1_write_bitstring(p,start,buf,0);
  return iVar1;
}

Assistant:

int mbedtls_asn1_write_named_bitstring(unsigned char **p,
                                       const unsigned char *start,
                                       const unsigned char *buf,
                                       size_t bits)
{
    size_t unused_bits, byte_len;
    const unsigned char *cur_byte;
    unsigned char cur_byte_shifted;
    unsigned char bit;

    byte_len = (bits + 7) / 8;
    unused_bits = (byte_len * 8) - bits;

    /*
     * Named bitstrings require that trailing 0s are excluded in the encoding
     * of the bitstring. Trailing 0s are considered part of the 'unused' bits
     * when encoding this value in the first content octet
     */
    if (bits != 0) {
        cur_byte = buf + byte_len - 1;
        cur_byte_shifted = *cur_byte >> unused_bits;

        for (;;) {
            bit = cur_byte_shifted & 0x1;
            cur_byte_shifted >>= 1;

            if (bit != 0) {
                break;
            }

            bits--;
            if (bits == 0) {
                break;
            }

            if (bits % 8 == 0) {
                cur_byte_shifted = *--cur_byte;
            }
        }
    }

    return mbedtls_asn1_write_bitstring(p, start, buf, bits);
}